

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Trap::Mark(Trap *this,Store *store)

{
  pointer pFVar1;
  Frame *frame;
  pointer this_00;
  
  pFVar1 = (this->trace_).
           super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->trace_).
                 super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1; this_00 = this_00 + 1)
  {
    Frame::Mark(this_00,store);
  }
  return;
}

Assistant:

void Trap::Mark(Store& store) {
  for (auto&& frame : trace_) {
    frame.Mark(store);
  }
}